

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.c
# Opt level: O3

ListNode * ListAddAfter(LinkedList *list,void *item,ListNode *bnode)

{
  LISTNODE *pLVar1;
  ListNode *pLVar2;
  
  if (list == (LinkedList *)0x0) {
    __assert_fail("list != NULL",".upnp/src/threadutil/LinkedList.c",0x86,
                  "ListNode *ListAddAfter(LinkedList *, void *, ListNode *)");
  }
  if ((bnode != (ListNode *)0x0) &&
     (pLVar2 = (ListNode *)FreeListAlloc(&list->freeNodeList), pLVar2 != (ListNode *)0x0)) {
    pLVar2->prev = (LISTNODE *)0x0;
    pLVar2->next = (LISTNODE *)0x0;
    pLVar2->item = item;
    pLVar1 = bnode->next;
    bnode->next = pLVar2;
    pLVar2->prev = bnode;
    pLVar2->next = pLVar1;
    pLVar1->prev = pLVar2;
    list->size = list->size + 1;
    return pLVar2;
  }
  return (ListNode *)0x0;
}

Assistant:

ListNode *ListAddAfter(LinkedList *list, void *item, ListNode *bnode)
{
	ListNode *newNode = NULL;

	assert(list != NULL);

	if (!list || !bnode)
		return NULL;
	newNode = CreateListNode(item, list);
	if (newNode) {
		ListNode *temp = bnode->next;

		bnode->next = newNode;
		newNode->prev = bnode;
		newNode->next = temp;
		temp->prev = newNode;
		list->size++;

		return newNode;
	}

	return NULL;
}